

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O1

void __thiscall
iu_Variant_x_iutest_x_CompareRawType_Test::Body(iu_Variant_x_iutest_x_CompareRawType_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_R9;
  int *val2;
  AssertionResult iutest_ar;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdd8;
  allocator<char> local_219;
  AssertionResult local_218;
  AssertionHelper local_1f0;
  _Variadic_union<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  byte local_1a0;
  _Variadic_union<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198 [4];
  ios_base local_118 [264];
  
  local_1c0._M_first._M_storage = (_Uninitialized<int,_true>)1;
  local_1a0 = 0;
  local_198[0]._M_first._M_storage = 1;
  iutest::internal::CmpHelperEQ<int,std::variant<int,float,std::__cxx11::string>>
            (&local_218,(internal *)0x140cca,"v",(char *)local_198,&local_1c0._M_first._M_storage,
             in_R9);
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x7e;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  paVar1 = &local_218.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 1;
  iutest::internal::CmpHelperEQ<std::variant<int,float,std::__cxx11::string>,int>
            (&local_218,(internal *)"v","1",(char *)&local_1c0,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_198[0]._M_first,(int *)in_R9);
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x7f;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 0;
  val2 = (int *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::backward::NeHelper<true>::
  Compare<int,std::variant<int,float,std::__cxx11::string>>
            (&local_218,(NeHelper<true> *)0x13f30d,"v",(char *)local_198,
             &local_1c0._M_first._M_storage,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffdd8);
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x80;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 0;
  iutest::internal::backward::NeHelper<false>::
  Compare<std::variant<int,float,std::__cxx11::string>,int>
            (&local_218,(NeHelper<false> *)"v","0",(char *)&local_1c0,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_198[0]._M_first,val2);
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x81;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 1;
  bVar2 = iutest::internal::iuOperatorLE<int,int,float,std::__cxx11::string>
                    (&local_198[0]._M_first._M_storage,
                     (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,(type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,std::variant<int,float,std::__cxx11::string>>
              (&local_218,(internal *)0x140cca,"v","<=",(char *)local_198,
               &local_1c0._M_first._M_storage,in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x82;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 1;
  bVar2 = iutest::internal::iuOperatorLE<int,float,std::__cxx11::string,int>
                    ((variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,&local_198[0]._M_first._M_storage,
                     (type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<std::variant<int,float,std::__cxx11::string>,int>
              (&local_218,(internal *)"v","1","<=",(char *)&local_1c0,
               (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_198[0]._M_first,(int *)in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x83;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 0;
  bVar2 = iutest::internal::iuOperatorLT<int,int,float,std::__cxx11::string>
                    (&local_198[0]._M_first._M_storage,
                     (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,(type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,std::variant<int,float,std::__cxx11::string>>
              (&local_218,(internal *)0x13f30d,"v","<",(char *)local_198,
               &local_1c0._M_first._M_storage,in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x84;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 2;
  bVar2 = iutest::internal::iuOperatorLT<int,float,std::__cxx11::string,int>
                    ((variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,&local_198[0]._M_first._M_storage,
                     (type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<std::variant<int,float,std::__cxx11::string>,int>
              (&local_218,(internal *)"v","2","<",(char *)&local_1c0,
               (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_198[0]._M_first,(int *)in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x85;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 1;
  bVar2 = iutest::internal::iuOperatorGE<int,int,float,std::__cxx11::string>
                    (&local_198[0]._M_first._M_storage,
                     (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,(type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,std::variant<int,float,std::__cxx11::string>>
              (&local_218,(internal *)0x140cca,"v",">=",(char *)local_198,
               &local_1c0._M_first._M_storage,in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x86;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 1;
  bVar2 = iutest::internal::iuOperatorGE<int,float,std::__cxx11::string,int>
                    ((variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,&local_198[0]._M_first._M_storage,
                     (type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<std::variant<int,float,std::__cxx11::string>,int>
              (&local_218,(internal *)"v","1",">=",(char *)&local_1c0,
               (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_198[0]._M_first,(int *)in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x87;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 2;
  bVar2 = iutest::internal::iuOperatorGT<int,int,float,std::__cxx11::string>
                    (&local_198[0]._M_first._M_storage,
                     (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,(type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,std::variant<int,float,std::__cxx11::string>>
              (&local_218,(internal *)0x13f24e,"v",">",(char *)local_198,
               &local_1c0._M_first._M_storage,in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x88;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_198[0]._M_first._M_storage = 0;
  bVar2 = iutest::internal::iuOperatorGT<int,float,std::__cxx11::string,int>
                    ((variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first,&local_198[0]._M_first._M_storage,
                     (type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar2) {
    local_218.m_message._M_string_length = 0;
    local_218.m_message.field_2._M_local_buf[0] = '\0';
    local_218.m_result = true;
    local_218.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    iutest::internal::CmpHelperOpFailure<std::variant<int,float,std::__cxx11::string>,int>
              (&local_218,(internal *)"v","0",">",(char *)&local_1c0,
               (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_198[0]._M_first,(int *)in_stack_fffffffffffffdd8);
  }
  if (local_218.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198[0]._M_first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_218.m_message._M_dataplus._M_p,&local_219);
    local_1f0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_1f0.m_part_result.super_iuCodeMessage.m_line = 0x89;
    local_1f0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f0,(Fixed *)&local_198[0]._M_first,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1f0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1f0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_198[0]._M_first);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_message._M_dataplus._M_p,
                    CONCAT71(local_218.m_message.field_2._M_allocated_capacity._1_7_,
                             local_218.m_message.field_2._M_local_buf[0]) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_1a0]._M_data)
            ((anon_class_1_0_00000001 *)&local_198[0]._M_first,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1c0._M_first);
  return;
}

Assistant:

IUTEST(Variant, CompareRawType)
{
    ::std::variant<int, float, ::std::string> v = 1;
    IUTEST_EXPECT_EQ(1, v);
    IUTEST_EXPECT_EQ(v, 1);
    IUTEST_EXPECT_NE(0, v);
    IUTEST_EXPECT_NE(v, 0);
    IUTEST_EXPECT_LE(1, v);
    IUTEST_EXPECT_LE(v, 1);
    IUTEST_EXPECT_LT(0, v);
    IUTEST_EXPECT_LT(v, 2);
    IUTEST_EXPECT_GE(1, v);
    IUTEST_EXPECT_GE(v, 1);
    IUTEST_EXPECT_GT(2, v);
    IUTEST_EXPECT_GT(v, 0);
}